

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

int Ssw_SecSpecialMiter(Aig_Man_t *p0,Aig_Man_t *p1,int nFrames,int fVerbose)

{
  int iVar1;
  int iVar2;
  int local_3c;
  Aig_Man_t *pAStack_38;
  int RetValue;
  Aig_Man_t *pPart1;
  Aig_Man_t *pPart0;
  int fVerbose_local;
  int nFrames_local;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  pPart0._0_4_ = fVerbose;
  pPart0._4_4_ = nFrames;
  _fVerbose_local = p1;
  p1_local = p0;
  if (fVerbose != 0) {
    printf("Performing sequential verification using combinational A/B miter.\n");
  }
  if (_fVerbose_local == (Aig_Man_t *)0x0) {
    if ((int)pPart0 != 0) {
      Aig_ManPrintStats(p1_local);
    }
    iVar1 = Saig_ManDemiterSimpleDiff(p1_local,&pPart1,&stack0xffffffffffffffc8);
    if (iVar1 == 0) {
      printf("Demitering has failed.\n");
      return -1;
    }
    iVar1 = Aig_ManRegNum(pPart1);
    iVar2 = Aig_ManRegNum(pAStack_38);
    if (iVar1 != iVar2) {
      Aig_ManStop(pPart1);
      Aig_ManStop(pAStack_38);
      printf("After demitering AIGs have different number of flops. Quitting.\n");
      return -1;
    }
  }
  else {
    pPart1 = Aig_ManDupSimple(p1_local);
    pAStack_38 = Aig_ManDupSimple(_fVerbose_local);
  }
  iVar1 = Aig_ManRegNum(pPart1);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(pPart0) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                  ,0x4b4,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
  }
  iVar1 = Aig_ManRegNum(pAStack_38);
  if (0 < iVar1) {
    iVar1 = Saig_ManPiNum(pPart1);
    iVar2 = Saig_ManPiNum(pAStack_38);
    if (iVar1 != iVar2) {
      __assert_fail("Saig_ManPiNum(pPart0) == Saig_ManPiNum(pPart1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                    ,0x4b6,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    iVar1 = Saig_ManPoNum(pPart1);
    iVar2 = Saig_ManPoNum(pAStack_38);
    if (iVar1 == iVar2) {
      iVar1 = Aig_ManRegNum(pPart1);
      iVar2 = Aig_ManRegNum(pAStack_38);
      if (iVar1 == iVar2) {
        local_3c = Ssw_SecSpecial(pPart1,pAStack_38,pPart0._4_4_,(int)pPart0);
        if (local_3c != 1) {
          iVar1 = Aig_ManNodeNum(pPart1);
          iVar2 = Aig_ManNodeNum(pAStack_38);
          if (iVar2 <= iVar1) {
            local_3c = Ssw_SecSpecial(pAStack_38,pPart1,pPart0._4_4_,(int)pPart0);
          }
        }
        Aig_ManStop(pPart1);
        Aig_ManStop(pAStack_38);
        return local_3c;
      }
      __assert_fail("Aig_ManRegNum(pPart0) == Aig_ManRegNum(pPart1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                    ,0x4b8,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    __assert_fail("Saig_ManPoNum(pPart0) == Saig_ManPoNum(pPart1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                  ,0x4b7,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
  }
  __assert_fail("Aig_ManRegNum(pPart1) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                ,0x4b5,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
}

Assistant:

int Ssw_SecSpecialMiter( Aig_Man_t * p0, Aig_Man_t * p1, int nFrames, int fVerbose )
{
    Aig_Man_t * pPart0, * pPart1;
    int RetValue;
    if ( fVerbose )
        printf( "Performing sequential verification using combinational A/B miter.\n" );
    // consider the case when a miter is given
    if ( p1 == NULL )
    {
        if ( fVerbose )
        {
            Aig_ManPrintStats( p0 );
        }
        // demiter the miter
        if ( !Saig_ManDemiterSimpleDiff( p0, &pPart0, &pPart1 ) )
        {
            printf( "Demitering has failed.\n" );
            return -1;
        }
        if ( Aig_ManRegNum(pPart0) != Aig_ManRegNum(pPart1) )
        {
            Aig_ManStop( pPart0 );
            Aig_ManStop( pPart1 );
            printf( "After demitering AIGs have different number of flops. Quitting.\n" );
            return -1;
        }
    }
    else
    {
        pPart0 = Aig_ManDupSimple( p0 );
        pPart1 = Aig_ManDupSimple( p1 );
    }
    if ( fVerbose )
    {
//        Aig_ManPrintStats( pPart0 );
//        Aig_ManPrintStats( pPart1 );
        if ( p1 == NULL )
        {
//        Aig_ManDumpBlif( pPart0, "part0.blif", NULL, NULL );
//        Aig_ManDumpBlif( pPart1, "part1.blif", NULL, NULL );
//        printf( "The result of demitering is written into files \"%s\" and \"%s\".\n", "part0.blif", "part1.blif" );
        }
    }
    assert( Aig_ManRegNum(pPart0) > 0 );
    assert( Aig_ManRegNum(pPart1) > 0 );
    assert( Saig_ManPiNum(pPart0) == Saig_ManPiNum(pPart1) );
    assert( Saig_ManPoNum(pPart0) == Saig_ManPoNum(pPart1) );
    assert( Aig_ManRegNum(pPart0) == Aig_ManRegNum(pPart1) );
    RetValue = Ssw_SecSpecial( pPart0, pPart1, nFrames, fVerbose );
    if ( RetValue != 1 && Aig_ManNodeNum(pPart0) >= Aig_ManNodeNum(pPart1) )
        RetValue = Ssw_SecSpecial( pPart1, pPart0, nFrames, fVerbose );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    return RetValue;
}